

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O3

void opj_pi_update_encoding_parameters(opj_image_t *p_image,opj_cp_t *p_cp,OPJ_UINT32 p_tile_no)

{
  uint uVar1;
  OPJ_UINT32 p_num_comps;
  uint p_tx0;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  uint p_tx1;
  int iVar9;
  long lVar10;
  long lVar11;
  opj_image_comp_t *poVar12;
  opj_tccp_t *poVar13;
  int iVar14;
  OPJ_UINT32 OVar15;
  ulong uVar16;
  OPJ_UINT32 p_dx_min;
  uint uVar17;
  OPJ_UINT32 p_max_res;
  uint uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  OPJ_UINT32 in_stack_ffffffffffffff10;
  int local_d0;
  
  if (p_cp == (opj_cp_t *)0x0) {
    __assert_fail("p_cp != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/pi.c"
                  ,0x804,
                  "void opj_pi_update_encoding_parameters(const opj_image_t *, opj_cp_t *, OPJ_UINT32)"
                 );
  }
  if (p_image == (opj_image_t *)0x0) {
    __assert_fail("p_image != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/pi.c"
                  ,0x805,
                  "void opj_pi_update_encoding_parameters(const opj_image_t *, opj_cp_t *, OPJ_UINT32)"
                 );
  }
  uVar1 = p_cp->tw;
  if (p_cp->th * uVar1 <= p_tile_no) {
    __assert_fail("p_tile_no < p_cp->tw * p_cp->th",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/pi.c"
                  ,0x806,
                  "void opj_pi_update_encoding_parameters(const opj_image_t *, opj_cp_t *, OPJ_UINT32)"
                 );
  }
  uVar18 = 0;
  uVar5 = p_cp->tdx;
  uVar8 = (p_tile_no % uVar1) * uVar5 + p_cp->tx0;
  uVar22 = p_cp->tdy;
  p_tx0 = p_image->x0;
  if (p_image->x0 < uVar8) {
    p_tx0 = uVar8;
  }
  p_tx1 = uVar8 + uVar5;
  if (CARRY4(uVar8,uVar5)) {
    p_tx1 = 0xffffffff;
  }
  if (p_image->x1 <= p_tx1) {
    p_tx1 = p_image->x1;
  }
  uVar5 = (p_tile_no / uVar1) * uVar22 + p_cp->ty0;
  uVar1 = p_image->y0;
  if (p_image->y0 < uVar5) {
    uVar1 = uVar5;
  }
  uVar8 = uVar5 + uVar22;
  if (CARRY4(uVar5,uVar22)) {
    uVar8 = 0xffffffff;
  }
  if (p_image->y1 <= uVar8) {
    uVar8 = p_image->y1;
  }
  p_num_comps = p_image->numcomps;
  if (p_num_comps == 0) {
    p_max_res = 0x7fffffff;
    uVar5 = 0;
    p_dx_min = 0x7fffffff;
  }
  else {
    poVar13 = p_cp->tcps[p_tile_no].tccps;
    poVar12 = p_image->comps;
    p_max_res = 0x7fffffff;
    uVar18 = 0;
    uVar5 = 0;
    p_dx_min = 0x7fffffff;
    OVar15 = 0;
    do {
      lVar10 = (long)(int)poVar12->dx;
      if (lVar10 == 0) {
LAB_001238f2:
        __assert_fail("b",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/opj_intmath.h"
                      ,0xa2,"OPJ_INT32 opj_int_ceildiv(OPJ_INT32, OPJ_INT32)");
      }
      lVar23 = (long)(int)poVar12->dy;
      if (lVar23 == 0) goto LAB_001238f2;
      uVar22 = poVar13->numresolutions;
      uVar24 = (ulong)uVar22;
      uVar19 = uVar22;
      if ((uVar5 < uVar22) || (uVar19 = uVar5, uVar22 != 0)) {
        uVar5 = uVar19;
        local_d0 = (int)(((int)uVar1 + lVar23 + -1) / lVar23);
        lVar11 = 0xec;
        uVar19 = uVar18;
        do {
          uVar22 = uVar22 - 1;
          bVar2 = (byte)uVar22;
          bVar3 = (byte)*(undefined4 *)((long)poVar13 + lVar11 * 4 + -0x84);
          uVar18 = poVar12->dx << (bVar2 + bVar3 & 0x1f);
          bVar4 = (byte)*(undefined4 *)((long)poVar13->stepsizes + lVar11 * 4 + -0x1c);
          uVar17 = poVar12->dy << (bVar2 + bVar4 & 0x1f);
          if (p_max_res < uVar18) {
            uVar18 = p_max_res;
          }
          p_max_res = uVar18;
          if (p_dx_min < uVar17) {
            uVar17 = p_dx_min;
          }
          p_dx_min = uVar17;
          uVar16 = -1L << (bVar2 & 0x3f) ^ 0xffffffffffffffff;
          iVar21 = (int)((long)((long)(int)(((int)p_tx0 + lVar10 + -1) / lVar10) + uVar16) >>
                        (bVar2 & 0x3f));
          iVar9 = (int)((long)((long)local_d0 + uVar16) >> (bVar2 & 0x3f));
          iVar20 = (int)((long)((long)(int)((lVar10 + -1 + (long)(int)p_tx1) / lVar10) + uVar16) >>
                        (bVar2 & 0x3f));
          iVar14 = (int)((long)(uVar16 + (long)(int)(((int)uVar8 + lVar23 + -1) / lVar23)) >>
                        (bVar2 & 0x3f));
          iVar6 = ((int)(~(-1L << (bVar3 & 0x3f)) + (long)iVar20 >> (bVar3 & 0x3f)) -
                   (iVar21 >> (bVar3 & 0x1f)) << (bVar3 & 0x1f)) >> (bVar3 & 0x1f);
          if (iVar21 == iVar20) {
            iVar6 = 0;
          }
          iVar20 = ((int)(~(-1L << (bVar4 & 0x3f)) + (long)iVar14 >> (bVar4 & 0x3f)) -
                    (iVar9 >> (bVar4 & 0x1f)) << (bVar4 & 0x1f)) >> (bVar4 & 0x1f);
          if (iVar9 == iVar14) {
            iVar20 = 0;
          }
          uVar18 = iVar20 * iVar6;
          if ((uint)(iVar20 * iVar6) <= uVar19) {
            uVar18 = uVar19;
          }
          lVar7 = lVar11 - uVar24;
          lVar11 = lVar11 + 1;
          uVar19 = uVar18;
        } while (lVar7 != 0xeb);
      }
      poVar12 = poVar12 + 1;
      poVar13 = poVar13 + 1;
      OVar15 = OVar15 + 1;
    } while (OVar15 != p_num_comps);
  }
  if ((p_cp->tcps[p_tile_no].field_0x1638 & 4) == 0) {
    opj_pi_update_encode_not_poc
              (p_cp,p_num_comps,p_tile_no,p_tx0,p_tx1,uVar1,uVar8,uVar18,uVar5,p_max_res,p_dx_min);
  }
  else {
    opj_pi_update_encode_poc_and_final
              (p_cp,p_tile_no,p_tx0,p_tx1,uVar1,uVar8,uVar18,p_max_res,p_dx_min,
               in_stack_ffffffffffffff10);
  }
  return;
}

Assistant:

void opj_pi_update_encoding_parameters(const opj_image_t *p_image,
                                       opj_cp_t *p_cp,
                                       OPJ_UINT32 p_tile_no)
{
    /* encoding parameters to set */
    OPJ_UINT32 l_max_res;
    OPJ_UINT32 l_max_prec;
    OPJ_INT32 l_tx0, l_tx1, l_ty0, l_ty1;
    OPJ_UINT32 l_dx_min, l_dy_min;

    /* pointers */
    opj_tcp_t *l_tcp = 00;

    /* preconditions */
    assert(p_cp != 00);
    assert(p_image != 00);
    assert(p_tile_no < p_cp->tw * p_cp->th);

    l_tcp = &(p_cp->tcps[p_tile_no]);

    /* get encoding parameters */
    opj_get_encoding_parameters(p_image, p_cp, p_tile_no, &l_tx0, &l_tx1, &l_ty0,
                                &l_ty1, &l_dx_min, &l_dy_min, &l_max_prec, &l_max_res);

    if (l_tcp->POC) {
        opj_pi_update_encode_poc_and_final(p_cp, p_tile_no, l_tx0, l_tx1, l_ty0, l_ty1,
                                           l_max_prec, l_max_res, l_dx_min, l_dy_min);
    } else {
        opj_pi_update_encode_not_poc(p_cp, p_image->numcomps, p_tile_no, l_tx0, l_tx1,
                                     l_ty0, l_ty1, l_max_prec, l_max_res, l_dx_min, l_dy_min);
    }
}